

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

size_t argparse::details::
       get_levenshtein_distance<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *s1,
                 basic_string_view<char,_std::char_traits<char>_> *s2)

{
  pointer pvVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  size_t j;
  ulong uVar9;
  unsigned_long uVar10;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  dp;
  allocator_type local_62;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  value_type_conflict1 local_48;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_40;
  ulong uVar11;
  
  sVar2 = s1->_M_len;
  local_48 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,s2->_M_len + 1,&local_48,&local_61);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_40,sVar2 + 1,&local_60,&local_62);
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar8 = 0;
  do {
    pcVar3 = s1->_M_str;
    pcVar4 = s2->_M_str;
    pvVar1 = local_40.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8;
    uVar9 = 0;
    do {
      if (uVar8 == 0) {
        ((local_40.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = uVar9;
      }
      else if (uVar9 == 0) {
        *(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start = uVar8;
      }
      else {
        puVar5 = pvVar1[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (pcVar3[uVar8 - 1] == pcVar4[uVar9 - 1]) {
          uVar10 = puVar5[uVar9 - 1];
        }
        else {
          uVar7 = puVar6[uVar9 - 1];
          uVar11 = puVar5[uVar9];
          if (uVar7 < puVar5[uVar9]) {
            uVar11 = uVar7;
          }
          if (puVar5[uVar9 - 1] < uVar11) {
            uVar11 = puVar5[uVar9 - 1];
          }
          uVar10 = uVar11 + 1;
        }
        puVar6[uVar9] = uVar10;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 <= s2->_M_len);
    uVar8 = uVar8 + 1;
  } while (uVar8 <= s1->_M_len);
  sVar2 = local_40.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[s1->_M_len].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[s2->_M_len];
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_40);
  return sVar2;
}

Assistant:

std::size_t get_levenshtein_distance(const StringType &s1,
                                     const StringType &s2) {
  std::vector<std::vector<std::size_t>> dp(
      s1.size() + 1, std::vector<std::size_t>(s2.size() + 1, 0));

  for (std::size_t i = 0; i <= s1.size(); ++i) {
    for (std::size_t j = 0; j <= s2.size(); ++j) {
      if (i == 0) {
        dp[i][j] = j;
      } else if (j == 0) {
        dp[i][j] = i;
      } else if (s1[i - 1] == s2[j - 1]) {
        dp[i][j] = dp[i - 1][j - 1];
      } else {
        dp[i][j] = 1 + std::min({dp[i - 1][j], dp[i][j - 1], dp[i - 1][j - 1]});
      }
    }
  }

  return dp[s1.size()][s2.size()];
}